

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O2

void ** hash_GetNode(HashMapEntry **map,char *key)

{
  HashMapEntry *pHVar1;
  HashType HVar2;
  int iVar3;
  HashMapEntry **ppHVar4;
  
  HVar2 = hash(key);
  ppHVar4 = map + (HVar2 & 0xffff);
  while( true ) {
    pHVar1 = *ppHVar4;
    if (pHVar1 == (HashMapEntry *)0x0) {
      return (void **)0x0;
    }
    if ((HVar2 >> 0x10 == (uint)pHVar1->hash) && (iVar3 = strcmp(pHVar1->key,key), iVar3 == 0))
    break;
    ppHVar4 = &pHVar1->next;
  }
  return &pHVar1->content;
}

Assistant:

void **hash_GetNode(HashMap const map, char const *key)
{
	HashType hashedKey = hash(key);
	struct HashMapEntry *ptr = map[(HalfHashType)hashedKey];

	while (ptr) {
		if (hashedKey >> HALF_HASH_NB_BITS == ptr->hash
		 && !strcmp(ptr->key, key)) {
			return &ptr->content;
		}
		ptr = ptr->next;
	}
	return NULL;
}